

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diy-fp.h
# Opt level: O1

void __thiscall FIX::double_conversion::DiyFp::Normalize(DiyFp *this)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = this->f_;
  if (uVar3 != 0) {
    iVar1 = this->e_;
    uVar2 = uVar3 >> 0x36;
    while (uVar2 == 0) {
      iVar1 = iVar1 + -10;
      uVar2 = uVar3 >> 0x2c;
      uVar3 = uVar3 << 10;
    }
    for (; -1 < (long)uVar3; uVar3 = uVar3 * 2) {
      iVar1 = iVar1 + -1;
    }
    this->f_ = uVar3;
    this->e_ = iVar1;
    return;
  }
  __assert_fail("f_ != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/diy-fp.h"
                ,0x4e,"void FIX::double_conversion::DiyFp::Normalize()");
}

Assistant:

void Normalize() {
    ASSERT(f_ != 0);
    uint64_t significand = f_;
    int exponent = e_;

    // This method is mainly called for normalizing boundaries. In general
    // boundaries need to be shifted by 10 bits. We thus optimize for this case.
    const uint64_t k10MSBits = UINT64_2PART_C(0xFFC00000, 00000000);
    while ((significand & k10MSBits) == 0) {
      significand <<= 10;
      exponent -= 10;
    }
    while ((significand & kUint64MSB) == 0) {
      significand <<= 1;
      exponent--;
    }
    f_ = significand;
    e_ = exponent;
  }